

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocusPerpIntercept.cpp
# Opt level: O2

int GeoCalcs::LocusPerpIntercept
              (Locus *loc,LLPoint *pt2,double *crsFromPt,double *distFromPt,LLPoint *intPt,
              double dTol)

{
  double __x;
  double dVar1;
  double dVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  LLPoint LVar6;
  double newDist;
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  double dStack_c0;
  double *local_b0;
  double *local_a8;
  double local_a0;
  InverseResult result;
  double local_78;
  double dStack_70;
  LLPoint geoPt;
  LLPoint local_40;
  
  result.azimuth = 0.0;
  result.reverseAzimuth = 0.0;
  result.distance = 0.0;
  DistVincenty(&loc->geoStart,&loc->geoEnd,&result);
  if (dTol <= ABS(loc->startDist - loc->endDist)) {
    local_d8 = result.distance;
    local_a0 = result.azimuth;
    DistVincenty(&loc->locusStart,&loc->locusEnd,&result);
    LVar6 = PerpIntercept(&loc->locusStart,result.azimuth,pt2,crsFromPt,distFromPt,dTol);
    geoPt.longitude = LVar6.longitude;
    geoPt.latitude = LVar6.latitude;
    local_b0 = distFromPt;
    local_a8 = crsFromPt;
    LVar6 = PerpIntercept(&loc->geoStart,local_a0,&geoPt,crsFromPt,distFromPt,dTol);
    local_40.longitude = LVar6.longitude;
    local_40.latitude = LVar6.latitude;
    __x = atan((loc->startDist - loc->endDist) / local_d8);
    local_78 = 0.0;
    dStack_70 = 0.0;
    local_c8 = 0.0;
    dStack_c0 = 0.0;
    DistVincenty(&loc->geoStart,&local_40,&result);
    newDist = 0.0;
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    dStack_c0 = result.distance;
    while( true ) {
      if ((uVar3 != 0) &&
         (((NAN(newDist) || (0xe < uVar3)) || (ABS((double)CONCAT44(uVar5,uVar4)) <= dTol))))
      goto LAB_0015160a;
      LVar6 = DestVincenty(&loc->geoStart,local_a0,dStack_c0);
      local_40.longitude = LVar6.longitude;
      local_40.latitude = LVar6.latitude;
      LVar6 = PointOnLocusP(loc,&local_40,dTol,5e-16);
      geoPt.longitude = LVar6.longitude;
      geoPt.latitude = LVar6.latitude;
      DistVincenty(&geoPt,pt2,&result);
      local_d8 = -result.distance;
      uStack_d0 = 0x8000000000000000;
      dVar1 = LocusCrsAtPoint(loc,&geoPt,&local_40,1e-08);
      dVar1 = SignAzimuthDifference(dVar1,result.azimuth);
      dStack_70 = cos(dVar1);
      dVar1 = dStack_c0;
      dStack_70 = dStack_70 * local_d8;
      if (ABS(dStack_70) < dTol) break;
      if (uVar3 == 0) {
        local_d8 = dStack_70;
        uStack_d0 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
        dVar2 = cos(__x);
        newDist = local_d8 * dVar2 + dVar1;
      }
      else {
        FindLinearRoot(&local_c8,&local_78,&newDist);
      }
      local_c8 = dStack_c0;
      local_78 = dStack_70;
      uVar4 = SUB84(dStack_70,0);
      uVar5 = (undefined4)((ulong)dStack_70 >> 0x20);
      uVar3 = uVar3 + 1;
      dStack_c0 = newDist;
    }
    *local_b0 = result.distance;
    *local_a8 = result.reverseAzimuth;
LAB_0015160a:
    intPt->latitude = geoPt.latitude;
    intPt->longitude = geoPt.longitude;
    DistVincenty(pt2,intPt,&result);
    *local_b0 = result.distance;
    *local_a8 = result.azimuth;
  }
  else {
    LVar6 = PerpIntercept(&loc->geoStart,result.azimuth,pt2,crsFromPt,distFromPt,dTol);
    geoPt.longitude = LVar6.longitude;
    geoPt.latitude = LVar6.latitude;
    LVar6 = PointOnLocusP(loc,&geoPt,dTol,5e-16);
    intPt->latitude = LVar6.latitude;
    intPt->longitude = LVar6.longitude;
    DistVincenty(pt2,intPt,&result);
    *distFromPt = result.distance;
    *crsFromPt = result.azimuth;
  }
  return 1;
}

Assistant:

int LocusPerpIntercept(const Locus &loc, const LLPoint &pt2, double &crsFromPt,
                           double &distFromPt, LLPoint &intPt, double dTol)
    {
        InverseResult result;
        DistVincenty(loc.geoStart, loc.geoEnd, result);
        double gcrs = result.azimuth;
        double gdist = result.distance;

        if (fabs(loc.startDist - loc.endDist) < dTol)
        {
            const LLPoint geoPt = PerpIntercept(loc.geoStart, gcrs, pt2, crsFromPt, distFromPt, dTol);
            intPt = PointOnLocusP(loc, geoPt, dTol, kEps);
            DistVincenty(pt2, intPt, result);
            distFromPt = result.distance;
            crsFromPt = result.azimuth;
            return 1;
        }

        DistVincenty(loc.locusStart, loc.locusEnd, result);
        LLPoint locPt = PerpIntercept(loc.locusStart, result.azimuth, pt2, crsFromPt, distFromPt, dTol);
        LLPoint geoPt = PerpIntercept(loc.geoStart, gcrs, locPt, crsFromPt, distFromPt, dTol);
        const double locAngle = atan((loc.startDist - loc.endDist) / gdist);

        double distarray[2], errarray[2];
        distarray[0] = distarray[1] = errarray[0] = errarray[1] = 0.0;

        DistVincenty(loc.geoStart, geoPt, result);
        distarray[1] = result.distance;

        const int maxCount = 15;
        double newDist = 0.0;
        int k = 0;
        while (k == 0 || (!std::isnan(newDist) && fabs(errarray[1]) > dTol && k < maxCount))
        {
            geoPt = DestVincenty(loc.geoStart, gcrs, distarray[1]);
            locPt = PointOnLocusP(loc /*loc.geoStart*/, geoPt, dTol, kEps);

            DistVincenty(locPt, pt2, result);
            errarray[1] = -result.distance * cos(fabs(
                    SignAzimuthDifference(LocusCrsAtPoint(loc, locPt, geoPt, 1e-8), result.azimuth)));

            if (fabs(errarray[1]) < dTol)
            {
                distFromPt = result.distance;
                crsFromPt = result.reverseAzimuth;
                intPt = locPt;
                break;
            }

            if (k == 0)
                newDist = distarray[1] + errarray[1] * cos(locAngle);
            else
                FindLinearRoot(distarray, errarray, newDist);
            distarray[0] = distarray[1];
            distarray[1] = newDist;
            errarray[0] = errarray[1];
            k++;
        }

        intPt = locPt;
        DistVincenty(pt2, intPt, result);
        distFromPt = result.distance;
        crsFromPt = result.azimuth;
        return 1;
    }